

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

void __thiscall kratos::Port::set_active_high(Port *this,bool value)

{
  int iVar1;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_70;
  Port *local_50;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  allocator_type local_21;
  
  iVar1 = (*(this->super_Var).super_IRNode._vptr_IRNode[7])();
  if (iVar1 == 1) {
    (this->active_high_).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)(value | 0x100);
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(this->super_Var).name._M_dataplus._M_p;
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)(this->super_Var).name._M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x3d;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_70,(detail *)"{0}\'s width is not 1, which can not be set as active high/low",
             format_str,args);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  local_50 = this;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_48,__l,&local_21);
  VarException::VarException(this_00,&local_70,&local_48);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Port::set_active_high(bool value) {
    if (width() != 1)
        throw VarException(
            ::format("{0}'s width is not 1, which can not be set as active high/low", name),
            {this});
    active_high_ = value;
}